

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O3

void cuddCacheResize(DdManager *table)

{
  undefined8 *puVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  DdCache *__ptr;
  DdCache *pDVar5;
  DdNode *pDVar6;
  double dVar7;
  uint uVar8;
  DdNode *pDVar9;
  _func_void_long *p_Var10;
  DdCache *pDVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  double dVar16;
  
  __ptr = table->acache;
  pDVar5 = table->cache;
  uVar3 = table->cacheSlots;
  uVar8 = uVar3 * 2;
  table->cacheSlots = uVar8;
  p_Var10 = Extra_UtilMMoutOfMemory;
  pDVar11 = (DdCache *)malloc((ulong)(uVar3 * 2 + 2) * 0x28);
  table->acache = pDVar11;
  Extra_UtilMMoutOfMemory = p_Var10;
  if (pDVar11 == (DdCache *)0x0) {
    table->cacheSlots = uVar3;
    table->acache = __ptr;
    table->maxCacheHard = uVar3 - 1;
    table->cacheSlack = ~uVar3;
  }
  else {
    pDVar11 = (DdCache *)((long)&pDVar11->f + (ulong)(0x20 - ((uint)pDVar11 & 0x1f) & 0xfffffff8));
    table->cache = pDVar11;
    if (((ulong)pDVar11 & 0x1f) != 0) {
      __assert_fail("((ptruint) table->cache & (32 - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCache.c"
                    ,0x3da,"void cuddCacheResize(DdManager *)");
    }
    iVar12 = table->cacheShift + -1;
    table->cacheShift = iVar12;
    table->memused = table->memused + (ulong)uVar3 * 0x28;
    table->cacheSlack = table->cacheSlack + uVar3 * -2;
    if (uVar8 != 0) {
      lVar14 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pDVar11->h + lVar14);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar14 = lVar14 + 0x28;
      } while ((ulong)uVar8 * 0x28 != lVar14);
    }
    if (uVar3 == 0) {
      dVar16 = 0.0;
    }
    else {
      lVar14 = 0;
      iVar13 = 0;
      do {
        pDVar6 = *(DdNode **)((long)&pDVar5->data + lVar14);
        if (pDVar6 != (DdNode *)0x0) {
          uVar4 = *(uint *)((long)&pDVar5->hash + lVar14);
          uVar15 = uVar4 >> ((byte)iVar12 & 0x1f);
          puVar1 = (undefined8 *)((long)&pDVar5->f + lVar14);
          pDVar9 = (DdNode *)puVar1[1];
          pDVar11[(int)uVar15].f = (DdNode *)*puVar1;
          pDVar11[(int)uVar15].g = pDVar9;
          pDVar11[(int)uVar15].h = *(ptruint *)((long)&pDVar5->h + lVar14);
          pDVar11[(int)uVar15].data = pDVar6;
          pDVar11[(int)uVar15].hash = uVar4;
          iVar13 = iVar13 + 1;
        }
        lVar14 = lVar14 + 0x28;
      } while ((ulong)uVar3 * 0x28 != lVar14);
      dVar16 = (double)iVar13;
    }
    if (__ptr != (DdCache *)0x0) {
      free(__ptr);
    }
    dVar7 = (double)(int)((double)uVar8 * table->minHit + 1.0);
    dVar2 = table->cacheMisses;
    table->cacheMisses = dVar7;
    table->totCachehits = table->cacheHits + table->totCachehits;
    table->totCacheMisses = (dVar2 - dVar7) + table->totCacheMisses;
    table->cacheHits = 0.0;
    table->cacheLastInserts = table->cacheinserts - dVar16;
  }
  return;
}

Assistant:

void
cuddCacheResize(
  DdManager * table)
{
    DdCache *cache, *oldcache, *oldacache, *entry, *old;
    int i;
    int posn, shift;
    unsigned int slots, oldslots;
    double offset;
    int moved = 0;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;
#ifndef DD_CACHE_PROFILE
    ptruint misalignment;
    DdNodePtr *mem;
#endif

    oldcache = table->cache;
    oldacache = table->acache;
    oldslots = table->cacheSlots;
    slots = table->cacheSlots = oldslots << 1;

#ifdef DD_VERBOSE
    (void) fprintf(table->err,"Resizing the cache from %d to %d entries\n",
                   oldslots, slots);
    (void) fprintf(table->err,
                   "\thits = %g\tmisses = %g\thit ratio = %5.3f\n",
                   table->cacheHits, table->cacheMisses,
                   table->cacheHits / (table->cacheHits + table->cacheMisses));
#endif

    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
//    table->acache = cache = ABC_ALLOC(DdCache,slots+1);
    table->acache = cache = ABC_ALLOC(DdCache,slots+2);
    MMoutOfMemory = saveHandler;
    /* If we fail to allocate the new table we just give up. */
    if (cache == NULL) {
#ifdef DD_VERBOSE
        (void) fprintf(table->err,"Resizing failed. Giving up.\n");
#endif
        table->cacheSlots = oldslots;
        table->acache = oldacache;
        /* Do not try to resize again. */
        table->maxCacheHard = oldslots - 1;
        table->cacheSlack = - (int) (oldslots + 1);
        return;
    }
    /* If the size of the cache entry is a power of 2, we want to
    ** enforce alignment to that power of two. This happens when
    ** DD_CACHE_PROFILE is not defined. */
#ifdef DD_CACHE_PROFILE
    table->cache = cache;
#else
    mem = (DdNodePtr *) cache;
//    misalignment = (ptruint) mem & (sizeof(DdCache) - 1);
//    mem += (sizeof(DdCache) - misalignment) / sizeof(DdNodePtr);
//    table->cache = cache = (DdCache *) mem;
//    assert(((ptruint) table->cache & (sizeof(DdCache) - 1)) == 0);
    misalignment = (ptruint) mem & (32 - 1);
    mem += (32 - misalignment) / sizeof(DdNodePtr);
    table->cache = cache = (DdCache *) mem;
    assert(((ptruint) table->cache & (32 - 1)) == 0);
#endif
    shift = --(table->cacheShift);
    table->memused += (slots - oldslots) * sizeof(DdCache);
    table->cacheSlack -= slots; /* need these many slots to double again */

    /* Clear new cache. */
    for (i = 0; (unsigned) i < slots; i++) {
        cache[i].data = NULL;
        cache[i].h = 0;
#ifdef DD_CACHE_PROFILE
        cache[i].count = 0;
#endif
    }

    /* Copy from old cache to new one. */
    for (i = 0; (unsigned) i < oldslots; i++) {
        old = &oldcache[i];
        if (old->data != NULL) {
//            posn = ddCHash2(old->h,old->f,old->g,shift);
            posn = old->hash >> shift;
            entry = &cache[posn];
            entry->f = old->f;
            entry->g = old->g;
            entry->h = old->h;
            entry->data = old->data;
#ifdef DD_CACHE_PROFILE
            entry->count = 1;
#endif
            entry->hash = old->hash;
            moved++;
        }
    }

    ABC_FREE(oldacache);

    /* Reinitialize measurements so as to avoid division by 0 and
    ** immediate resizing.
    */
    offset = (double) (int) (slots * table->minHit + 1);
    table->totCacheMisses += table->cacheMisses - offset;
    table->cacheMisses = offset;
    table->totCachehits += table->cacheHits;
    table->cacheHits = 0;
    table->cacheLastInserts = table->cacheinserts - (double) moved;

}